

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O2

void __thiscall
nuraft::asio_rpc_client::ctx_read
          (asio_rpc_client *this,ptr<req_msg> *req,ptr<resp_msg> *rsp,rpc_handler *when_done,
          ptr<buffer> *ctx_buf,uint32_t flags,error_code err,size_t bytes_transferred)

{
  element_type *peVar1;
  bool bVar2;
  uint16_t uVar3;
  size_t sVar4;
  void *pvVar5;
  int64_t iVar6;
  int iVar7;
  int iVar8;
  size_t resp_meta_len;
  buffer_serializer bs;
  string local_98;
  size_t local_70;
  buffer_serializer local_68;
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  if ((flags & 3) == 0) {
    buffer::pos((ctx_buf->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,0);
    peVar1 = (rsp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,&ctx_buf->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(peVar1->ctx_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>,
               &local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
    ::cancel(&this->operation_timer_);
    set_busy_flag(this,false);
    local_98._M_dataplus._M_p = (pointer)0x0;
    local_98._M_string_length = 0;
    std::
    function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
    operator()(when_done,rsp,(shared_ptr<nuraft::rpc_exception> *)&local_98);
    goto LAB_001a0b0d;
  }
  buffer_serializer::buffer_serializer(&local_68,ctx_buf,LITTLE);
  sVar4 = buffer::size((ctx_buf->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr);
  iVar8 = (int)sVar4;
  if ((flags & 1) != 0) {
    local_70 = 0;
    pvVar5 = buffer_serializer::get_bytes(&local_68,&local_70);
    sVar4 = local_70;
    if ((this->impl_->my_opt_).read_resp_meta_.super__Function_base._M_manager == (_Manager_type)0x0
       ) {
LAB_001a0a31:
      iVar7 = (int)sVar4;
    }
    else {
      if ((local_70 == 0) && ((this->impl_->my_opt_).invoke_resp_cb_on_empty_meta_ != true)) {
        sVar4 = 0;
        goto LAB_001a0a31;
      }
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,pvVar5,local_70 + (long)pvVar5);
      bVar2 = handle_custom_resp_meta(this,req,rsp,when_done,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      if (!bVar2) {
        return;
      }
      iVar7 = (int)local_70;
    }
    iVar8 = (iVar8 - iVar7) + -4;
  }
  if ((flags & 2) != 0) {
    buffer_serializer::get_u16(&local_68);
    uVar3 = buffer_serializer::get_u16(&local_68);
    peVar1 = (rsp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar6 = buffer_serializer::get_i64(&local_68);
    peVar1->next_batch_size_hint_in_bytes_ = iVar6;
    iVar8 = (iVar8 - (uint)uVar3) + -4;
  }
  if (iVar8 != 0) {
    buffer::alloc((buffer *)&local_98,(long)iVar8);
    buffer_serializer::get_buffer(&local_68,(ptr<buffer> *)&local_98);
    peVar1 = (rsp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,(__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)&local_98);
    std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(peVar1->ctx_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>,
               &local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98._M_string_length);
  }
  asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  ::cancel(&this->operation_timer_);
  set_busy_flag(this,false);
  local_98._M_dataplus._M_p = (pointer)0x0;
  local_98._M_string_length = 0;
  std::
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
  operator()(when_done,rsp,(shared_ptr<nuraft::rpc_exception> *)&local_98);
LAB_001a0b0d:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98._M_string_length);
  return;
}

Assistant:

void ctx_read(ptr<req_msg>& req,
                  ptr<resp_msg>& rsp,
                  rpc_handler& when_done,
                  ptr<buffer>& ctx_buf,
                  uint32_t flags,
                  std::error_code err,
                  size_t bytes_transferred)
    {
        if ( !(flags & INCLUDE_META) &&
             !(flags & INCLUDE_HINT) ) {
            // Neither meta nor hint exists,
            // just use the buffer as it is for ctx.
            ctx_buf->pos(0);
            rsp->set_ctx(ctx_buf);

            operation_timer_.cancel();
            set_busy_flag(false);
            ptr<rpc_exception> except;
            when_done(rsp, except);
            return;
        }

        // Otherwise: buffer contains composite data.
        buffer_serializer bs(ctx_buf);
        int remaining_len = ctx_buf->size();

        // 1) Custom meta.
        if (flags & INCLUDE_META) {
            size_t resp_meta_len = 0;
            void* resp_meta_raw = bs.get_bytes(resp_meta_len);

            // If callback is given, verify meta
            // (if meta is empty, invoke callback according to the flag).
            if ( impl_->get_options().read_resp_meta_ &&
                 ( resp_meta_len ||
                   impl_->get_options().invoke_resp_cb_on_empty_meta_ ) ) {

                bool meta_ok = handle_custom_resp_meta
                               ( req, rsp, when_done,
                                 std::string( (const char*)resp_meta_raw,
                                              resp_meta_len) );
                if (!meta_ok) return;
            }
            remaining_len -= sizeof(int32) + resp_meta_len;
        }

        // 2) Hint.
        if (flags & INCLUDE_HINT) {
            size_t hint_len = 0;
            uint16_t hint_version = bs.get_u16();
            (void)hint_version;
            hint_len = bs.get_u16();
            rsp->set_next_batch_size_hint_in_bytes(bs.get_i64());
            remaining_len -= sizeof(uint16_t) * 2 + hint_len;
        }

        // 3) Context.
        assert(remaining_len >= 0);
        if (remaining_len) {
            // It has context, read it.
            ptr<buffer> actual_ctx = buffer::alloc(remaining_len);
            bs.get_buffer(actual_ctx);
            rsp->set_ctx(actual_ctx);
        }

        operation_timer_.cancel();
        set_busy_flag(false);
        ptr<rpc_exception> except;
        when_done(rsp, except);
    }